

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O2

int tinyusdz::USDZReadAsset
              (char *resolved_asset_name,uint64_t req_bytes,uint8_t *out_buf,uint64_t *nbytes,
              string *err,void *userdata)

{
  mapped_type *pmVar1;
  ulong __n;
  char *__rhs;
  int iVar2;
  allocator local_a1;
  ulong local_a0;
  key_type local_98;
  ulong local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (userdata == (void *)0x0) {
    iVar2 = -1;
  }
  else if (resolved_asset_name == (char *)0x0) {
    iVar2 = -2;
  }
  else {
    if (out_buf != (uint8_t *)0x0) {
      if (nbytes == (uint64_t *)0x0) {
        iVar2 = -2;
        goto joined_r0x00116faf;
      }
      ::std::__cxx11::string::string((string *)&local_98,resolved_asset_name,(allocator *)&local_70)
      ;
      local_a0 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                 ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                          *)userdata,&local_98);
      ::std::__cxx11::string::_M_dispose();
      if (local_a0 == 0) {
        iVar2 = -1;
        if (err == (string *)0x0) {
          return -1;
        }
        ::std::__cxx11::string::string((string *)&local_50,resolved_asset_name,&local_a1);
        ::std::operator+(&local_70,"resolved_asset_name `",&local_50);
        __rhs = "` not found in USDZAsset.\n";
LAB_00117041:
        ::std::operator+(&local_98,&local_70,__rhs);
        ::std::__cxx11::string::append((string *)err);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        return iVar2;
      }
      ::std::__cxx11::string::string((string *)&local_98,resolved_asset_name,(allocator *)&local_70)
      ;
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
               ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                     *)userdata,&local_98);
      local_a0 = pmVar1->first;
      local_78 = pmVar1->second;
      ::std::__cxx11::string::_M_dispose();
      __n = local_78 - local_a0;
      if (local_a0 <= local_78 && __n != 0) {
        if (req_bytes < __n) {
          iVar2 = -2;
          if (err == (string *)0x0) {
            return -2;
          }
          ::std::__cxx11::string::string((string *)&local_50,resolved_asset_name,&local_a1);
          ::std::operator+(&local_70,"USDZAsset ",&local_50);
          __rhs = "\'s size exceeds requested bytes.\n";
        }
        else {
          if (local_78 <=
              (ulong)(*(long *)((long)userdata + 0x38) - *(long *)((long)userdata + 0x30))) {
            memcpy(out_buf,(void *)(*(long *)((long)userdata + 0x30) + local_a0),__n);
            *nbytes = __n;
            return 0;
          }
          iVar2 = -2;
          if (err == (string *)0x0) {
            return -2;
          }
          ::std::__cxx11::string::string((string *)&local_50,resolved_asset_name,&local_a1);
          ::std::operator+(&local_70,"Invalid USDZAsset size: ",&local_50);
          __rhs = "\n";
        }
        goto LAB_00117041;
      }
    }
    iVar2 = -2;
  }
joined_r0x00116faf:
  if (err != (string *)0x0) {
    ::std::__cxx11::string::append((char *)err);
  }
  return iVar2;
}

Assistant:

int USDZReadAsset(const char *resolved_asset_name, uint64_t req_bytes, uint8_t *out_buf, uint64_t *nbytes, std::string *err, void *userdata) {
  if (!userdata) {
    if (err) {
      (*err) += "`userdata` must be non-null.\n";
    }
    return -1;
  }

  if (!resolved_asset_name) {
    if (err) {
      (*err) += "`resolved_asset_name` must be non-null.\n";
    }
    return -2;
  }

  if (!out_buf) {
    if (err) {
      (*err) += "`out_buf` must be non-null.\n";
    }
    return -2;
  }

  if (!nbytes) {
    if (err) {
      (*err) += "`nbytes` must be non-null.\n";
    }
    return -2;
  }

  const USDZAsset *passet = reinterpret_cast<const USDZAsset *>(userdata);

  if (!passet->asset_map.count(resolved_asset_name)) {
    if (err) {
      (*err) += "resolved_asset_name `" + std::string(resolved_asset_name) + "` not found in USDZAsset.\n";
    }
    return -1;
  }

  std::pair<size_t, size_t> byte_range = passet->asset_map.at(resolved_asset_name);

  if (byte_range.first >= byte_range.second) {
    if (err) {
      (*err) += "Invalid USDZAsset byte range.\n";
    }
    return -2;
  }

  size_t sz = byte_range.second - byte_range.first;

  if (sz > req_bytes) {
    if (err) {
      (*err) += "USDZAsset " + std::string(resolved_asset_name) + "'s size exceeds requested bytes.\n";
    }
    return -2;
  }

  if (byte_range.first + sz > passet->data.size()) {
    if (err) {
      (*err) += "Invalid USDZAsset size: " + std::string(resolved_asset_name) + "\n";
    }
    return -2;
  }

  memcpy(out_buf, passet->data.data() + byte_range.first, sz);
  (*nbytes) = sz;

  return 0;
}